

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall aiString::Set(aiString *this,char *sz)

{
  ai_uint32 aVar1;
  size_t sVar2;
  
  sVar2 = strlen(sz);
  aVar1 = (ai_uint32)sVar2;
  if ((int)aVar1 < 0x400) {
    this->length = aVar1;
    memcpy(this->data,sz,(long)(int)aVar1);
    this->data[(int)aVar1] = '\0';
  }
  return;
}

Assistant:

void Set( const char* sz) {
        const ai_int32 len = (ai_uint32) ::strlen(sz);
        if( len > (ai_int32)MAXLEN - 1) {
            return;
        }
        length = len;
        memcpy( data, sz, len);
        data[len] = 0;
    }